

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  ulong size;
  uint uVar1;
  void *pvVar2;
  char *__s;
  upb_Arena *in_RDX;
  byte in_SIL;
  
  if (in_SIL < 0x20) {
    uVar1 = -1 << (in_SIL & 0x1f);
    *(undefined4 *)(ctx + 8) = 0;
    *(uint *)(ctx + 0xc) = ~uVar1;
    size = (ulong)-uVar1 * 0x18;
    __s = in_RDX->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)in_RDX->end_dont_copy_me__upb_internal_use_only - (long)__s) < size) {
      __s = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(in_RDX,size);
    }
    else {
      if ((char *)((ulong)(__s + 7) & 0xfffffffffffffff8) != __s) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      in_RDX->ptr_dont_copy_me__upb_internal_use_only = __s + size;
    }
    *(char **)ctx = __s;
    if (__s != (char *)0x0) {
      pvVar2 = memset(__s,0,size);
      return (int)CONCAT71((int7)((ulong)pvVar2 >> 8),1);
    }
  }
  return 0;
}

Assistant:

static bool init(upb_table* t, uint8_t size_lg2, upb_Arena* a) {
  if (size_lg2 >= 32) {
    return false;
  }
  t->count = 0;
  uint32_t size = 1 << size_lg2;
  t->mask = size - 1;  // 0 mask if size_lg2 is 0
  if (upb_table_size(t) > (SIZE_MAX / sizeof(upb_tabent))) {
    return false;
  }
  size_t bytes = upb_table_size(t) * sizeof(upb_tabent);
  if (bytes > 0) {
    t->entries = upb_Arena_Malloc(a, bytes);
    if (!t->entries) return false;
    memset(t->entries, 0, bytes);
  } else {
    t->entries = NULL;
  }
  return true;
}